

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O0

int handle_start_map(void *ctx)

{
  int iVar1;
  yajl_val pyVar2;
  yajl_val in_RDI;
  yajl_val v;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar3;
  
  pyVar2 = value_alloc((yajl_type)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  if (pyVar2 == (yajl_val)0x0) {
    if ((in_RDI->u).object.values != (yajl_val *)0x0) {
      snprintf((char *)(in_RDI->u).object.values,(in_RDI->u).object.len,"Out of memory");
    }
    uVar3 = 0;
  }
  else {
    (pyVar2->u).string = (char *)0x0;
    (pyVar2->u).number.d = 0.0;
    (pyVar2->u).number.r = (char *)0x0;
    iVar1 = context_push((context_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI);
    uVar3 = (uint)(iVar1 == 0);
  }
  return uVar3;
}

Assistant:

static int handle_start_map (void *ctx)
{
    yajl_val v;

    v = value_alloc(yajl_t_object);
    if (v == NULL)
        RETURN_ERROR ((context_t *) ctx, STATUS_ABORT, "Out of memory");

    v->u.object.keys = NULL;
    v->u.object.values = NULL;
    v->u.object.len = 0;

    return ((context_push (ctx, v) == 0) ? STATUS_CONTINUE : STATUS_ABORT);
}